

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.h
# Opt level: O1

void __thiscall GmmLib::MidLevelTable::~MidLevelTable(MidLevelTable *this)

{
  uint32_t *puVar1;
  LastLevelTable *pLVar2;
  LastLevelTable *pLVar3;
  
  pLVar3 = this->pTTL1;
  if (pLVar3 != (LastLevelTable *)0x0) {
    do {
      puVar1 = (pLVar3->super_Table).UsedEntries;
      pLVar2 = pLVar3->pNext;
      if (puVar1 != (uint32_t *)0x0) {
        operator_delete__(puVar1);
      }
      operator_delete(pLVar3);
      pLVar3 = pLVar2;
    } while (pLVar2 != (LastLevelTable *)0x0);
    this->pTTL1 = (LastLevelTable *)0x0;
  }
  return;
}

Assistant:

~MidLevelTable()
        {
            if (pTTL1)
            {
                LastLevelTable* item = pTTL1;

                while (item)
                {
                    LastLevelTable* nextItem = item->Next();
                    delete item;
                    item = nextItem;
                }

                pTTL1 = NULL;
            }
        }